

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

bool __thiscall ON_Texture::IsTiled(ON_Texture *this,int dir,double *count,double *offset)

{
  double dVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ON_Xform *pOVar5;
  ulong uVar6;
  
  if (count != (double *)0x0) {
    *count = 1.0;
  }
  if (offset != (double *)0x0) {
    *offset = 0.0;
  }
  if ((uint)dir < 4) {
    uVar3 = 0xffffffffffffffff;
    pOVar5 = &this->m_uvw;
    for (uVar4 = 0; iVar2 = (int)uVar3, uVar4 != 3; uVar4 = uVar4 + 1) {
      for (uVar6 = 0; uVar6 != 3; uVar6 = uVar6 + 1) {
        if (((uint)dir != uVar6) &&
           ((dVar1 = pOVar5->m_xform[0][uVar6], dVar1 != 0.0 || (NAN(dVar1))))) goto LAB_004f1d6d;
      }
      uVar3 = uVar4 & 0xffffffff;
      if (iVar2 != -1) {
        return false;
      }
LAB_004f1d6d:
      pOVar5 = (ON_Xform *)(pOVar5->m_xform + 1);
    }
    if (-1 < iVar2) {
      if (count != (double *)0x0) {
        *count = (this->m_uvw).m_xform[uVar3 & 0xffffffff][(uint)dir];
      }
      if (offset != (double *)0x0) {
        *offset = (this->m_uvw).m_xform[uVar3 & 0xffffffff][3];
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_Texture::IsTiled( int dir, double* count, double* offset ) const
{
  if ( count )
    *count = 1.0;
  if ( offset )
    *offset = 0.0;

  if ( 0 <= dir && dir <= 3 )
  {
    int row0=-1, row, col;
    for ( row = 0; row < 3; row++ )
    {
      for ( col = 0; col < 3; col++ )
      {
        if ( col != dir && 0.0 != m_uvw.m_xform[row][col] )
          break;
      }
      if ( 3 == col )
      {
        if ( -1 == row0 )
        {
          row0 = row;
        }
        else
          return false;
      }
    }
    if ( row0 >= 0 )
    {
      if (count)
        *count = m_uvw.m_xform[row0][dir];
      if ( offset )
        *offset = m_uvw.m_xform[row0][3];
      return true;
    }
  }

  return false;
}